

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O0

lua_State * luaL_newstate(void)

{
  lua_State *L_00;
  lua_State *L;
  
  L_00 = lua_newstate((lua_Alloc)&DAT_00004d50,(void *)0x0);
  if (L_00 != (lua_State *)0x0) {
    *(code **)((L_00->glref).ptr64 + 0x160) = panic;
    luaL_findtable(L_00,-10000,"_VMEVENTS",4);
    lua_pushcclosure(L_00,error_finalizer,0);
    lua_rawseti(L_00,-2,-0x69363bc0);
    *(undefined1 *)((L_00->glref).ptr64 + 0x93) = 0x10;
    L_00->top = L_00->top + -1;
  }
  return L_00;
}

Assistant:

LUALIB_API lua_State *luaL_newstate(void)
{
  lua_State *L;
#if LJ_64 && !LJ_GC64
  L = lj_state_newstate(LJ_ALLOCF_INTERNAL, NULL);
#else
  L = lua_newstate(LJ_ALLOCF_INTERNAL, NULL);
#endif
  if (L) {
    G(L)->panic = panic;
#ifndef LUAJIT_DISABLE_VMEVENT
    luaL_findtable(L, LUA_REGISTRYINDEX, LJ_VMEVENTS_REGKEY, LJ_VMEVENTS_HSIZE);
    lua_pushcfunction(L, error_finalizer);
    lua_rawseti(L, -2, VMEVENT_HASH(LJ_VMEVENT_ERRFIN));
    G(L)->vmevmask = VMEVENT_MASK(LJ_VMEVENT_ERRFIN);
    L->top--;
#endif
  }
  return L;
}